

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O3

string * __thiscall
sznet::detail::FixedBuffer<4000000>::toString_abi_cxx11_
          (string *__return_storage_ptr__,FixedBuffer<4000000> *this)

{
  int iVar1;
  
  iVar1 = *(int *)&this->m_cur;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,(int)this,this->m_data + (iVar1 - (int)this));
  return __return_storage_ptr__;
}

Assistant:

string toString() const
	{
		return string(m_data, length());
	}